

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

Wlc_Ntk_t * Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit)

{
  int iVar1;
  Smt_Prs_t *p_00;
  Smt_Prs_t *p;
  Wlc_Ntk_t *pWStack_30;
  int nCount;
  Wlc_Ntk_t *pNtk;
  char *pLimit_local;
  char *pBuffer_local;
  char *pFileName_local;
  
  pWStack_30 = (Wlc_Ntk_t *)0x0;
  iVar1 = Smt_PrsRemoveComments(pBuffer,pLimit);
  p_00 = Smt_PrsAlloc(pFileName,pBuffer,pLimit,iVar1);
  if (p_00 == (Smt_Prs_t *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    Smt_PrsReadLines(p_00);
    iVar1 = Smt_PrsErrorPrint(p_00);
    if (iVar1 != 0) {
      pWStack_30 = Smt_PrsBuild(p_00);
    }
    Smt_PrsFree(p_00);
    pFileName_local = (char *)pWStack_30;
  }
  return (Wlc_Ntk_t *)pFileName_local;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    //Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = Smt_PrsBuild( p );
    Smt_PrsFree( p );
    return pNtk;
}